

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmType GetVmType(ExpressionContext *ctx,TypeBase *type)

{
  bool bVar1;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  TypeBase *local_10;
  
  if (type == ctx->typeVoid) {
    local_10 = VmType::Void.structType;
    ctx_local = (ExpressionContext *)VmType::Void._0_8_;
  }
  else if ((((type == ctx->typeBool) || (type == ctx->typeChar)) || (type == ctx->typeShort)) ||
          (type == ctx->typeInt)) {
    local_10 = VmType::Int.structType;
    ctx_local = (ExpressionContext *)VmType::Int._0_8_;
  }
  else if (type == ctx->typeLong) {
    local_10 = VmType::Long.structType;
    ctx_local = (ExpressionContext *)VmType::Long._0_8_;
  }
  else if ((type == ctx->typeFloat) || (type == ctx->typeDouble)) {
    local_10 = VmType::Double.structType;
    ctx_local = (ExpressionContext *)VmType::Double._0_8_;
  }
  else {
    bVar1 = isType<TypeRef>(type);
    if (bVar1) {
      _ctx_local = VmType::Pointer(type);
    }
    else {
      bVar1 = isType<TypeFunction>(type);
      if (bVar1) {
        _ctx_local = VmType::FunctionRef(type);
      }
      else {
        bVar1 = isType<TypeUnsizedArray>(type);
        if (bVar1) {
          _ctx_local = VmType::ArrayRef(type);
        }
        else {
          bVar1 = isType<TypeAutoRef>(type);
          if (bVar1) {
            local_10 = VmType::AutoRef.structType;
            ctx_local = (ExpressionContext *)VmType::AutoRef._0_8_;
          }
          else {
            bVar1 = isType<TypeAutoArray>(type);
            if (bVar1) {
              local_10 = VmType::AutoArray.structType;
              ctx_local = (ExpressionContext *)VmType::AutoArray._0_8_;
            }
            else {
              bVar1 = isType<TypeTypeID>(type);
              if (bVar1) {
                local_10 = VmType::Int.structType;
                ctx_local = (ExpressionContext *)VmType::Int._0_8_;
              }
              else {
                bVar1 = isType<TypeFunctionID>(type);
                if (bVar1) {
                  local_10 = VmType::Int.structType;
                  ctx_local = (ExpressionContext *)VmType::Int._0_8_;
                }
                else {
                  bVar1 = isType<TypeNullptr>(type);
                  if (bVar1) {
                    _ctx_local = VmType::Pointer(type);
                  }
                  else {
                    bVar1 = isType<TypeArray>(type);
                    if ((!bVar1) && (bVar1 = isType<TypeClass>(type), !bVar1)) {
                      bVar1 = isType<TypeEnum>(type);
                      if (bVar1) {
                        local_10 = VmType::Int.structType;
                        ctx_local = (ExpressionContext *)VmType::Int._0_8_;
                        return _ctx_local;
                      }
                      __assert_fail("!\"unknown type\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                    ,0x9b2,"VmType GetVmType(ExpressionContext &, TypeBase *)");
                    }
                    if (type->size % 4 != 0) {
                      __assert_fail("type->size % 4 == 0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                    ,0x9a9,"VmType GetVmType(ExpressionContext &, TypeBase *)");
                    }
                    if (0xfffffff < type->size) {
                      __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                                    ,0x9aa,"VmType GetVmType(ExpressionContext &, TypeBase *)");
                    }
                    _ctx_local = VmType::Struct(type->size,type);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return _ctx_local;
}

Assistant:

VmType GetVmType(ExpressionContext &ctx, TypeBase *type)
{
	if(type == ctx.typeVoid)
		return VmType::Void;

	if(type == ctx.typeBool || type == ctx.typeChar || type == ctx.typeShort || type == ctx.typeInt)
		return VmType::Int;

	if(type == ctx.typeLong)
		return VmType::Long;

	if(type == ctx.typeFloat || type == ctx.typeDouble)
		return VmType::Double;

	if(isType<TypeRef>(type))
		return VmType::Pointer(type);

	if(isType<TypeFunction>(type))
		return VmType::FunctionRef(type);

	if(isType<TypeUnsizedArray>(type))
		return VmType::ArrayRef(type);

	if(isType<TypeAutoRef>(type))
		return VmType::AutoRef;

	if(isType<TypeAutoArray>(type))
		return VmType::AutoArray;

	if(isType<TypeTypeID>(type))
		return VmType::Int;

	if(isType<TypeFunctionID>(type))
		return VmType::Int;

	if(isType<TypeNullptr>(type))
		return VmType::Pointer(type);

	if(isType<TypeArray>(type) || isType<TypeClass>(type))
	{
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VmType::Struct(type->size, type);
	}

	if(isType<TypeEnum>(type))
		return VmType::Int;

	assert(!"unknown type");

	return VmType::Void;
}